

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ncc_rule.cpp
# Opt level: O0

void line_ncc_rule(int n,double a,double b,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  double local_58;
  double y_b;
  double y_a;
  int local_40;
  int k;
  int j;
  int i;
  double *d;
  double *w_local;
  double *x_local;
  double b_local;
  double a_local;
  int n_local;
  
  r8vec_linspace(n,a,b,x);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (k = 0; k < n; k = k + 1) {
    for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
      *(undefined8 *)((long)pvVar3 + (long)local_40 * 8) = 0;
    }
    *(undefined8 *)((long)pvVar3 + (long)k * 8) = 0x3ff0000000000000;
    for (local_40 = 2; local_40 <= n; local_40 = local_40 + 1) {
      for (y_a._4_4_ = local_40; y_a._4_4_ <= n; y_a._4_4_ = y_a._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)(((n + local_40) - y_a._4_4_) + -1) * 8) =
             (*(double *)((long)pvVar3 + (long)(((n + local_40) - y_a._4_4_) + -2) * 8) -
             *(double *)((long)pvVar3 + (long)(((n + local_40) - y_a._4_4_) + -1) * 8)) /
             (x[n - y_a._4_4_] - x[((n + local_40) - y_a._4_4_) + -1]);
      }
    }
    for (local_40 = 1; local_40 <= n + -1; local_40 = local_40 + 1) {
      for (y_a._4_4_ = 1; y_a._4_4_ <= n - local_40; y_a._4_4_ = y_a._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)((n - y_a._4_4_) + -1) * 8) =
             -x[(n - y_a._4_4_) - local_40] * *(double *)((long)pvVar3 + (long)(n - y_a._4_4_) * 8)
             + *(double *)((long)pvVar3 + (long)((n - y_a._4_4_) + -1) * 8);
      }
    }
    y_b = *(double *)((long)pvVar3 + (long)(n + -1) * 8) / (double)n;
    for (local_40 = n + -2; -1 < local_40; local_40 = local_40 + -1) {
      y_b = y_b * a + *(double *)((long)pvVar3 + (long)local_40 * 8) / (double)(local_40 + 1);
    }
    local_58 = *(double *)((long)pvVar3 + (long)(n + -1) * 8) / (double)n;
    for (local_40 = n + -2; -1 < local_40; local_40 = local_40 + -1) {
      local_58 = local_58 * b +
                 *(double *)((long)pvVar3 + (long)local_40 * 8) / (double)(local_40 + 1);
    }
    w[k] = local_58 * b - y_b * a;
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void line_ncc_rule ( int n, double a, double b, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LINE_NCC_RULE computes a Newton-Cotes Closed (NCC) quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( A <= X <= B ) F(X) dx
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double A, B, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double y_a;
  double y_b;
//
//  Define the points X.
//
  r8vec_linspace ( n, a, b, x );

  d = new double[n];

  for ( i = 0; i < n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 0; j < n; j++ )
    {
      d[j] = 0.0;
    }
    d[i] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the endpoints.
//
    y_a = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_a = y_a * a + d[j] / double( j + 1 );
    }
    y_a = y_a * a;

    y_b = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_b = y_b * b + d[j] / double( j + 1 );
    }
    y_b = y_b * b;

    w[i] = y_b - y_a;
  }

  delete [] d;

  return;
}